

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tctok.cpp
# Opt level: O0

void __thiscall CTcTokenizer::pp_if(CTcTokenizer *this)

{
  int iVar1;
  CTcTokenizer *in_RDI;
  CTcConstVal val;
  tok_if_t state;
  tc_constval_type_t in_stack_ffffffffffffffd0;
  int in_stack_ffffffffffffffd4;
  undefined4 in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffdc;
  undefined4 in_stack_ffffffffffffffe0;
  undefined4 in_stack_ffffffffffffffe4;
  undefined4 in_stack_ffffffffffffffe8;
  undefined4 in_stack_ffffffffffffffec;
  CTcConstVal *in_stack_fffffffffffffff0;
  CTcTokenizer *this_00;
  
  this_00 = in_RDI;
  CTcConstVal::CTcConstVal((CTcConstVal *)&stack0xffffffffffffffd0);
  iVar1 = expand_macros_curline
                    ((CTcTokenizer *)CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8),
                     in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0,in_stack_ffffffffffffffdc);
  state = (tok_if_t)((ulong)in_RDI >> 0x20);
  if (iVar1 == 0) {
    clear_linebuf((CTcTokenizer *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0));
    start_new_line((CTcTokenizer *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
                   (CTcTokString *)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8),
                   in_stack_ffffffffffffffd4);
    iVar1 = pp_parse_expr(this_00,in_stack_fffffffffffffff0,in_stack_ffffffffffffffec,
                          in_stack_ffffffffffffffe8,in_stack_ffffffffffffffe4);
    if (iVar1 != 0) {
      CTcConstVal::set_bool((CTcConstVal *)&stack0xffffffffffffffd0,1);
    }
    CTcConstVal::get_val_bool
              ((CTcConstVal *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0));
    push_if((CTcTokenizer *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),state);
  }
  else {
    clear_linebuf((CTcTokenizer *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0));
    push_if((CTcTokenizer *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),state);
  }
  return;
}

Assistant:

void CTcTokenizer::pp_if()
{
    CTcConstVal val;
    
    /* expand macros; don't allow reading additional lines */
    if (expand_macros_curline(FALSE, TRUE, FALSE))
        goto do_error;

    /* 
     *   we don't need the original source line any more, and we don't
     *   want to copy it to the preprocessed output, so clear it 
     */
    clear_linebuf();

    /* parse out of the expansion buffer */
    start_new_line(&expbuf_, 0);

    /* parse the preprocessor expression */
    if (pp_parse_expr(&val, TRUE, TRUE, TRUE))
    {
        /* 
         *   we can't get a value; treat the expression as true and
         *   continue parsing, so that we don't throw off the #if nesting
         *   level 
         */
        val.set_bool(TRUE);
    }

    /* push the new state according to the value of the expression */
    push_if(val.get_val_bool() ? TOKIF_IF_YES : TOKIF_IF_NO);

    /* done */
    return;

do_error:
    /* clear the line buffer */
    clear_linebuf();

    /* 
     *   push a true if - even though we can't evaluate the condition, we
     *   can at least avoid a cascade of errors for the matching #endif
     *   and #else 
     */
    push_if(TOKIF_IF_YES);
}